

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_Nodes.hpp
# Opt level: O2

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::UListLeaf::insert
          (UListLeaf *this,LeafData *ld)

{
  SelectedLiteral local_40;
  
  Kernel::SelectedLiteral::SelectedLiteral(&local_40,&ld->super_SelectedLiteral);
  Lib::List<Inferences::ALASCA::BinaryResolutionConf::Lhs>::push((Lhs *)&local_40,&this->_children);
  this->_size = this->_size + 1;
  return;
}

Assistant:

inline
  void insert(LeafData ld) final override
  {
    LDList::push(ld, _children);
    _size++;
  }